

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fieldpos.h
# Opt level: O3

bool __thiscall
icu_63::number::impl::NumberStringBuilder::nextFieldPosition
          (NumberStringBuilder *this,FieldPosition *fp,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  UNumberFormatFields UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  UNumberFormatFields UVar12;
  ValueOrHeapArray<UNumberFormatFields> *pVVar13;
  
  UVar3 = fp->fField;
  if (UVar3 != ~UNUM_INTEGER_FIELD) {
    if (UVar3 < UNUM_FIELD_COUNT) {
      iVar11 = fp->fEndIndex;
      if (iVar11 <= this->fLength) {
        iVar4 = this->fZero;
        iVar7 = this->fLength + iVar4;
        iVar10 = iVar4 + iVar11;
        bVar2 = this->fUsingHeap;
        lVar9 = (long)iVar10;
        iVar5 = iVar7;
        if (iVar7 < iVar10) {
          iVar5 = iVar10;
        }
        iVar8 = -1;
        bVar6 = false;
        iVar10 = iVar4;
        do {
          UVar12 = UNUM_FIELD_COUNT;
          if (lVar9 < iVar7) {
            pVVar13 = &this->fFields;
            if ((bVar2 & 1U) != 0) {
              pVVar13 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
            }
            UVar12 = pVVar13->value[lVar9];
          }
          if (((bool)(bVar6 ^ 1U)) || (UVar3 == UVar12)) {
            if ((bool)((bVar6 ^ 1U) & UVar3 == UVar12)) {
              fp->fBeginIndex = iVar11;
              iVar10 = this->fZero;
              bVar6 = true;
            }
            if ((UVar12 & ~UNUM_DECIMAL_SEPARATOR_FIELD) == UNUM_INTEGER_FIELD) {
              iVar8 = ((iVar4 + iVar11) - iVar10) + 1;
            }
          }
          else if ((UVar3 != UNUM_INTEGER_FIELD) || (UVar12 != UNUM_GROUPING_SEPARATOR_FIELD)) {
            fp->fEndIndex = iVar11;
            goto LAB_0026eb48;
          }
          lVar9 = lVar9 + 1;
          iVar1 = (iVar4 - iVar5) + iVar11;
          iVar11 = iVar11 + 1;
          if (iVar1 == 0) {
LAB_0026eb48:
            if (UVar3 != UNUM_FRACTION_FIELD) {
              return bVar6;
            }
            if (bVar6 != false) {
              return bVar6;
            }
            if (iVar8 == -1) {
              return false;
            }
            fp->fBeginIndex = iVar8;
            fp->fEndIndex = iVar8;
            return false;
          }
        } while( true );
      }
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return false;
}

Assistant:

int32_t getField(void) const { return fField; }